

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# av1_fwd_txfm2d_sse4.c
# Opt level: O3

void lowbd_fwd_txfm2d_64x32_sse4_1(int16_t *input,int32_t *output,int stride,TX_TYPE tx_type,int bd)

{
  undefined4 *puVar1;
  byte bVar2;
  transform_1d_sse2 p_Var3;
  undefined2 uVar4;
  undefined8 uVar5;
  undefined1 auVar6 [12];
  undefined1 auVar7 [12];
  undefined1 auVar8 [12];
  undefined1 auVar9 [12];
  int8_t *piVar10;
  int iVar11;
  int16_t *piVar12;
  uint uVar13;
  undefined7 in_register_00000009;
  long lVar14;
  int32_t *piVar15;
  long lVar16;
  int iVar17;
  undefined1 *puVar18;
  undefined4 uVar19;
  __m128i round_1;
  undefined1 auVar21 [16];
  undefined1 auVar23 [16];
  undefined4 uVar24;
  __m128i round;
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined4 uVar43;
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar53 [16];
  undefined4 uVar54;
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  __m128i buf0 [64];
  __m128i bufB [64];
  __m128i bufA [64];
  __m128i buf1 [256];
  longlong local_1c38 [2];
  undefined2 auStack_1c28 [8];
  undefined1 auStack_1c18 [16];
  undefined2 auStack_1c08 [8];
  undefined1 auStack_1bf8 [16];
  undefined2 auStack_1be8 [8];
  undefined1 auStack_1bd8 [16];
  undefined2 auStack_1bc8 [456];
  undefined8 local_1838;
  int aiStack_1830 [254];
  undefined8 local_1438;
  int aiStack_1430 [254];
  undefined1 local_1038 [112];
  undefined1 local_fc8 [3992];
  undefined1 auVar20 [12];
  undefined1 auVar22 [16];
  undefined1 auVar25 [12];
  undefined1 auVar26 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar44 [12];
  undefined1 auVar45 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar55 [12];
  undefined1 auVar56 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  
  piVar10 = av1_fwd_txfm_shift_ls[0xc];
  p_Var3 = col_txfm8x32_arr[CONCAT71(in_register_00000009,tx_type) & 0xffffffff];
  puVar18 = local_fc8;
  lVar16 = 0;
  do {
    lVar14 = 0;
    piVar12 = input;
    do {
      uVar5 = *(undefined8 *)(piVar12 + 4);
      *(undefined8 *)((long)local_1c38 + lVar14) = *(undefined8 *)piVar12;
      *(undefined8 *)((long)auStack_1c28 + lVar14 + -8) = uVar5;
      lVar14 = lVar14 + 0x10;
      piVar12 = piVar12 + stride;
    } while (lVar14 != 0x200);
    bVar2 = *piVar10;
    uVar13 = (uint)(char)bVar2;
    if ((int)uVar13 < 0) {
      auVar21 = ZEXT416((uint)(1 << (~bVar2 & 0x1f)));
      auVar21 = pshuflw(auVar21,auVar21,0);
      auVar21._4_4_ = auVar21._0_4_;
      auVar21._8_4_ = auVar21._0_4_;
      auVar21._12_4_ = auVar21._0_4_;
      lVar14 = 0;
      do {
        auVar42 = paddsw(*(undefined1 (*) [16])((long)local_1c38 + lVar14),auVar21);
        auVar42 = psraw(auVar42,ZEXT416(-uVar13));
        *(undefined1 (*) [16])((long)local_1c38 + lVar14) = auVar42;
        lVar14 = lVar14 + 0x10;
      } while (lVar14 != 0x200);
    }
    else if (bVar2 != 0) {
      lVar14 = 0;
      do {
        auVar21 = psllw(*(undefined1 (*) [16])((long)local_1c38 + lVar14),ZEXT416(uVar13));
        *(undefined1 (*) [16])((long)local_1c38 + lVar14) = auVar21;
        lVar14 = lVar14 + 0x10;
      } while (lVar14 != 0x200);
    }
    (*p_Var3)(&local_1c38,&local_1c38,'\f');
    bVar2 = piVar10[1];
    uVar13 = (uint)(char)bVar2;
    if ((int)uVar13 < 0) {
      auVar21 = ZEXT416((uint)(1 << (~bVar2 & 0x1f)));
      auVar21 = pshuflw(auVar21,auVar21,0);
      auVar42._0_4_ = auVar21._0_4_;
      auVar42._4_4_ = auVar42._0_4_;
      auVar42._8_4_ = auVar42._0_4_;
      auVar42._12_4_ = auVar42._0_4_;
      lVar14 = 0;
      do {
        auVar21 = paddsw(*(undefined1 (*) [16])((long)local_1c38 + lVar14),auVar42);
        auVar21 = psraw(auVar21,ZEXT416(-uVar13));
        *(undefined1 (*) [16])((long)local_1c38 + lVar14) = auVar21;
        lVar14 = lVar14 + 0x10;
      } while (lVar14 != 0x200);
    }
    else if (bVar2 != 0) {
      lVar14 = 0;
      do {
        auVar21 = psllw(*(undefined1 (*) [16])((long)local_1c38 + lVar14),ZEXT416(uVar13));
        *(undefined1 (*) [16])((long)local_1c38 + lVar14) = auVar21;
        lVar14 = lVar14 + 0x10;
      } while (lVar14 != 0x200);
    }
    lVar14 = 0;
    do {
      auVar21 = *(undefined1 (*) [16])((long)local_1c38 + lVar14);
      auVar42 = *(undefined1 (*) [16])((long)auStack_1c28 + lVar14 + 0x10);
      auVar33._0_12_ = auVar21._0_12_;
      auVar33._12_2_ = auVar21._6_2_;
      auVar33._14_2_ = *(undefined2 *)((long)auStack_1c28 + lVar14 + 6);
      auVar32._12_4_ = auVar33._12_4_;
      auVar32._0_10_ = auVar21._0_10_;
      auVar32._10_2_ = *(undefined2 *)((long)auStack_1c28 + lVar14 + 4);
      auVar31._10_6_ = auVar32._10_6_;
      auVar31._0_8_ = auVar21._0_8_;
      auVar31._8_2_ = auVar21._4_2_;
      auVar6._4_8_ = auVar31._8_8_;
      auVar6._2_2_ = *(undefined2 *)((long)auStack_1c28 + lVar14 + 2);
      auVar6._0_2_ = auVar21._2_2_;
      auVar30._0_4_ = CONCAT22(*(undefined2 *)((long)auStack_1c28 + lVar14),auVar21._0_2_);
      auVar30._4_12_ = auVar6;
      auVar52._0_12_ = auVar42._0_12_;
      auVar52._12_2_ = auVar42._6_2_;
      auVar52._14_2_ = *(undefined2 *)((long)auStack_1c08 + lVar14 + 6);
      auVar51._12_4_ = auVar52._12_4_;
      auVar51._0_10_ = auVar42._0_10_;
      auVar51._10_2_ = *(undefined2 *)((long)auStack_1c08 + lVar14 + 4);
      auVar50._10_6_ = auVar51._10_6_;
      auVar50._0_8_ = auVar42._0_8_;
      auVar50._8_2_ = auVar42._4_2_;
      auVar7._4_8_ = auVar50._8_8_;
      auVar7._2_2_ = *(undefined2 *)((long)auStack_1c08 + lVar14 + 2);
      auVar7._0_2_ = auVar42._2_2_;
      auVar26 = *(undefined1 (*) [16])((long)auStack_1c08 + lVar14 + 0x10);
      auVar39._0_12_ = auVar26._0_12_;
      auVar39._12_2_ = auVar26._6_2_;
      auVar39._14_2_ = *(undefined2 *)((long)auStack_1be8 + lVar14 + 6);
      auVar38._12_4_ = auVar39._12_4_;
      auVar38._0_10_ = auVar26._0_10_;
      auVar38._10_2_ = *(undefined2 *)((long)auStack_1be8 + lVar14 + 4);
      auVar37._10_6_ = auVar38._10_6_;
      auVar37._0_8_ = auVar26._0_8_;
      auVar37._8_2_ = auVar26._4_2_;
      auVar8._4_8_ = auVar37._8_8_;
      auVar8._2_2_ = *(undefined2 *)((long)auStack_1be8 + lVar14 + 2);
      auVar8._0_2_ = auVar26._2_2_;
      auVar36._0_4_ = CONCAT22(*(undefined2 *)((long)auStack_1be8 + lVar14),auVar26._0_2_);
      auVar36._4_12_ = auVar8;
      auVar33 = *(undefined1 (*) [16])((long)auStack_1be8 + lVar14 + 0x10);
      uVar4 = *(undefined2 *)((long)auStack_1bc8 + lVar14);
      auVar60._0_12_ = auVar33._0_12_;
      auVar60._12_2_ = auVar33._6_2_;
      auVar60._14_2_ = *(undefined2 *)((long)auStack_1bc8 + lVar14 + 6);
      auVar59._12_4_ = auVar60._12_4_;
      auVar59._0_10_ = auVar33._0_10_;
      auVar59._10_2_ = *(undefined2 *)((long)auStack_1bc8 + lVar14 + 4);
      auVar58._10_6_ = auVar59._10_6_;
      auVar58._0_8_ = auVar33._0_8_;
      auVar58._8_2_ = auVar33._4_2_;
      auVar9._4_8_ = auVar58._8_8_;
      auVar9._2_2_ = *(undefined2 *)((long)auStack_1bc8 + lVar14 + 2);
      auVar9._0_2_ = auVar33._2_2_;
      uVar19 = CONCAT22(*(undefined2 *)((long)auStack_1c28 + lVar14 + 8),auVar21._8_2_);
      auVar20._0_8_ =
           CONCAT26(*(undefined2 *)((long)auStack_1c28 + lVar14 + 10),
                    CONCAT24(auVar21._10_2_,uVar19));
      auVar20._8_2_ = auVar21._12_2_;
      auVar20._10_2_ = *(undefined2 *)((long)auStack_1c28 + lVar14 + 0xc);
      auVar22._12_2_ = auVar21._14_2_;
      auVar22._0_12_ = auVar20;
      auVar22._14_2_ = *(undefined2 *)((long)auStack_1c28 + lVar14 + 0xe);
      uVar43 = CONCAT22(*(undefined2 *)((long)auStack_1c08 + lVar14 + 8),auVar42._8_2_);
      auVar44._0_8_ =
           CONCAT26(*(undefined2 *)((long)auStack_1c08 + lVar14 + 10),
                    CONCAT24(auVar42._10_2_,uVar43));
      auVar44._8_2_ = auVar42._12_2_;
      auVar44._10_2_ = *(undefined2 *)((long)auStack_1c08 + lVar14 + 0xc);
      auVar45._12_2_ = auVar42._14_2_;
      auVar45._0_12_ = auVar44;
      auVar45._14_2_ = *(undefined2 *)((long)auStack_1c08 + lVar14 + 0xe);
      uVar24 = CONCAT22(*(undefined2 *)((long)auStack_1be8 + lVar14 + 8),auVar26._8_2_);
      auVar25._0_8_ =
           CONCAT26(*(undefined2 *)((long)auStack_1be8 + lVar14 + 10),
                    CONCAT24(auVar26._10_2_,uVar24));
      auVar25._8_2_ = auVar26._12_2_;
      auVar25._10_2_ = *(undefined2 *)((long)auStack_1be8 + lVar14 + 0xc);
      auVar26._12_2_ = auVar26._14_2_;
      auVar26._0_12_ = auVar25;
      auVar26._14_2_ = *(undefined2 *)((long)auStack_1be8 + lVar14 + 0xe);
      uVar54 = CONCAT22(*(undefined2 *)((long)auStack_1bc8 + lVar14 + 8),auVar33._8_2_);
      auVar55._0_8_ =
           CONCAT26(*(undefined2 *)((long)auStack_1bc8 + lVar14 + 10),
                    CONCAT24(auVar33._10_2_,uVar54));
      auVar55._8_2_ = auVar33._12_2_;
      auVar55._10_2_ = *(undefined2 *)((long)auStack_1bc8 + lVar14 + 0xc);
      auVar56._12_2_ = auVar33._14_2_;
      auVar56._0_12_ = auVar55;
      auVar56._14_2_ = *(undefined2 *)((long)auStack_1bc8 + lVar14 + 0xe);
      auVar47._0_8_ = auVar30._0_8_;
      auVar47._8_4_ = auVar6._0_4_;
      auVar47._12_4_ = auVar7._0_4_;
      auVar49._0_8_ = auVar36._0_8_;
      auVar49._8_4_ = auVar8._0_4_;
      auVar49._12_4_ = auVar9._0_4_;
      auVar53._8_4_ = (int)((ulong)auVar20._0_8_ >> 0x20);
      auVar53._0_8_ = auVar20._0_8_;
      auVar53._12_4_ = (int)((ulong)auVar44._0_8_ >> 0x20);
      auVar57._8_4_ = (int)((ulong)auVar25._0_8_ >> 0x20);
      auVar57._0_8_ = auVar25._0_8_;
      auVar57._12_4_ = (int)((ulong)auVar55._0_8_ >> 0x20);
      auVar34._0_8_ = CONCAT44(auVar50._8_4_,auVar31._8_4_);
      auVar34._8_4_ = auVar32._12_4_;
      auVar34._12_4_ = auVar51._12_4_;
      auVar40._0_8_ = CONCAT44(auVar58._8_4_,auVar37._8_4_);
      auVar40._8_4_ = auVar38._12_4_;
      auVar40._12_4_ = auVar59._12_4_;
      auVar27._0_8_ = CONCAT44(auVar55._8_4_,auVar25._8_4_);
      auVar27._8_4_ = auVar26._12_4_;
      auVar27._12_4_ = auVar56._12_4_;
      *(ulong *)(puVar18 + lVar14 * 8 + -0x70) =
           CONCAT44(CONCAT22(*(undefined2 *)((long)auStack_1c08 + lVar14),auVar42._0_2_),
                    auVar30._0_4_);
      *(ulong *)((long)(puVar18 + lVar14 * 8 + -0x70) + 8) =
           CONCAT44(CONCAT22(uVar4,auVar33._0_2_),auVar36._0_4_);
      auVar48._8_8_ = auVar49._8_8_;
      auVar48._0_8_ = auVar47._8_8_;
      *(undefined1 (*) [16])(puVar18 + lVar14 * 8 + -0x60) = auVar48;
      auVar46._8_8_ = auVar40._0_8_;
      auVar46._0_8_ = auVar34._0_8_;
      *(undefined1 (*) [16])(puVar18 + lVar14 * 8 + -0x50) = auVar46;
      *(long *)(puVar18 + lVar14 * 8 + -0x40) = auVar34._8_8_;
      *(long *)((long)(puVar18 + lVar14 * 8 + -0x40) + 8) = auVar40._8_8_;
      *(ulong *)(puVar18 + lVar14 * 8 + -0x30) = CONCAT44(uVar43,uVar19);
      *(ulong *)((long)(puVar18 + lVar14 * 8 + -0x30) + 8) = CONCAT44(uVar54,uVar24);
      *(long *)(puVar18 + lVar14 * 8 + -0x20) = auVar53._8_8_;
      *(long *)((long)(puVar18 + lVar14 * 8 + -0x20) + 8) = auVar57._8_8_;
      puVar1 = (undefined4 *)(puVar18 + lVar14 * 8 + -0x10);
      *puVar1 = auVar20._8_4_;
      puVar1[1] = auVar44._8_4_;
      *(undefined8 *)(puVar1 + 2) = auVar27._0_8_;
      *(int *)(puVar18 + lVar14 * 8 + 8) = auVar22._12_4_;
      *(int *)(puVar18 + lVar14 * 8 + 0xc) = auVar45._12_4_;
      *(long *)(puVar18 + lVar14 * 8 + 8) = auVar27._8_8_;
      lVar14 = lVar14 + 0x80;
    } while (lVar14 != 0x200);
    lVar16 = lVar16 + 1;
    input = input + 8;
    puVar18 = puVar18 + 0x80;
  } while (lVar16 != 8);
  piVar15 = output + 4;
  puVar18 = local_1038;
  lVar16 = 0;
  do {
    lVar14 = 0;
    do {
      auVar21 = *(undefined1 (*) [16])(puVar18 + lVar14);
      auVar27 = pmovsxwd(auVar27,auVar21);
      *(undefined1 (*) [16])((long)&local_1438 + lVar14) = auVar27;
      auVar23._8_4_ = auVar21._8_4_;
      auVar23._12_4_ = auVar21._12_4_;
      auVar23._0_8_ = auVar21._8_8_;
      auVar21 = pmovsxwd(auVar23,auVar23);
      *(undefined1 (*) [16])((long)&local_1838 + lVar14) = auVar21;
      lVar14 = lVar14 + 0x10;
    } while (lVar14 != 0x400);
    av1_fdct64_sse4_1((__m128i *)&local_1438,(__m128i *)&local_1438,'\v',1,1);
    av1_fdct64_sse4_1((__m128i *)&local_1838,(__m128i *)&local_1838,'\v',1,1);
    bVar2 = piVar10[2];
    iVar11 = (int)(char)bVar2;
    if (iVar11 < 0) {
      iVar17 = 1 << (~bVar2 & 0x1f);
      auVar21 = ZEXT416((uint)-iVar11);
      lVar14 = 0;
      auVar46 = pmovsxwd(auVar46,0x16a116a116a116a1);
      auVar48 = pmovsxwd(auVar48,0x800080008000800);
      do {
        auVar41._0_4_ = *(int *)((long)&local_1438 + lVar14) + iVar17 >> auVar21;
        auVar41._4_4_ = *(int *)((long)&local_1438 + lVar14 + 4) + iVar17 >> auVar21;
        auVar41._8_4_ = *(int *)((long)aiStack_1430 + lVar14) + iVar17 >> auVar21;
        auVar41._12_4_ = *(int *)((long)aiStack_1430 + lVar14 + 4) + iVar17 >> auVar21;
        auVar42 = pmulld(auVar41,auVar46);
        *(int *)((long)&local_1438 + lVar14) = auVar42._0_4_ + auVar48._0_4_ >> 0xc;
        *(int *)((long)&local_1438 + lVar14 + 4) = auVar42._4_4_ + auVar48._4_4_ >> 0xc;
        *(int *)((long)aiStack_1430 + lVar14) = auVar42._8_4_ + auVar48._8_4_ >> 0xc;
        *(int *)((long)aiStack_1430 + lVar14 + 4) = auVar42._12_4_ + auVar48._12_4_ >> 0xc;
        lVar14 = lVar14 + 0x10;
      } while (lVar14 != 0x200);
    }
    else {
      lVar14 = 0;
      auVar46 = pmovsxwd(auVar46,0x16a116a116a116a1);
      auVar48 = pmovsxwd(auVar48,0x800080008000800);
      do {
        auVar28._0_4_ = *(int *)((long)&local_1438 + lVar14) << iVar11;
        auVar28._4_4_ = *(undefined4 *)((long)&local_1438 + lVar14 + 4);
        auVar28._8_4_ = *(undefined4 *)((long)aiStack_1430 + lVar14);
        auVar28._12_4_ = *(undefined4 *)((long)aiStack_1430 + lVar14 + 4);
        auVar21 = pmulld(auVar28,auVar46);
        *(int *)((long)&local_1438 + lVar14) = auVar21._0_4_ + auVar48._0_4_ >> 0xc;
        *(int *)((long)&local_1438 + lVar14 + 4) = auVar21._4_4_ + auVar48._4_4_ >> 0xc;
        *(int *)((long)aiStack_1430 + lVar14) = auVar21._8_4_ + auVar48._8_4_ >> 0xc;
        *(int *)((long)aiStack_1430 + lVar14 + 4) = auVar21._12_4_ + auVar48._12_4_ >> 0xc;
        lVar14 = lVar14 + 0x10;
      } while (lVar14 != 0x200);
    }
    if ((char)bVar2 < '\0') {
      iVar17 = 1 << (~bVar2 & 0x1f);
      auVar27 = ZEXT416((uint)-iVar11);
      lVar14 = 0;
      do {
        auVar35._0_4_ = *(int *)((long)&local_1838 + lVar14) + iVar17 >> auVar27;
        auVar35._4_4_ = *(int *)((long)&local_1838 + lVar14 + 4) + iVar17 >> auVar27;
        auVar35._8_4_ = *(int *)((long)aiStack_1830 + lVar14) + iVar17 >> auVar27;
        auVar35._12_4_ = *(int *)((long)aiStack_1830 + lVar14 + 4) + iVar17 >> auVar27;
        auVar21 = pmulld(auVar35,auVar46);
        *(int *)((long)&local_1838 + lVar14) = auVar21._0_4_ + auVar48._0_4_ >> 0xc;
        *(int *)((long)&local_1838 + lVar14 + 4) = auVar21._4_4_ + auVar48._4_4_ >> 0xc;
        *(int *)((long)aiStack_1830 + lVar14) = auVar21._8_4_ + auVar48._8_4_ >> 0xc;
        *(int *)((long)aiStack_1830 + lVar14 + 4) = auVar21._12_4_ + auVar48._12_4_ >> 0xc;
        lVar14 = lVar14 + 0x10;
      } while (lVar14 != 0x200);
    }
    else {
      lVar14 = 0;
      do {
        auVar29._0_4_ = *(int *)((long)&local_1838 + lVar14) << iVar11;
        auVar29._4_4_ = *(undefined4 *)((long)&local_1838 + lVar14 + 4);
        auVar29._8_4_ = *(undefined4 *)((long)aiStack_1830 + lVar14);
        auVar29._12_4_ = *(undefined4 *)((long)aiStack_1830 + lVar14 + 4);
        auVar21 = pmulld(auVar29,auVar46);
        auVar27._0_4_ = auVar21._0_4_ + auVar48._0_4_ >> 0xc;
        auVar27._4_4_ = auVar21._4_4_ + auVar48._4_4_ >> 0xc;
        auVar27._8_4_ = auVar21._8_4_ + auVar48._8_4_ >> 0xc;
        auVar27._12_4_ = auVar21._12_4_ + auVar48._12_4_ >> 0xc;
        *(undefined1 (*) [16])((long)&local_1838 + lVar14) = auVar27;
        lVar14 = lVar14 + 0x10;
      } while (lVar14 != 0x200);
    }
    lVar14 = 0;
    do {
      uVar5 = *(undefined8 *)((long)aiStack_1430 + lVar14);
      *(undefined8 *)(piVar15 + lVar14 * 2 + -4) = *(undefined8 *)((long)&local_1438 + lVar14);
      *(undefined8 *)(piVar15 + lVar14 * 2 + -4 + 2) = uVar5;
      uVar5 = *(undefined8 *)((long)aiStack_1830 + lVar14);
      *(undefined8 *)(piVar15 + lVar14 * 2) = *(undefined8 *)((long)&local_1838 + lVar14);
      *(undefined8 *)(piVar15 + lVar14 * 2 + 2) = uVar5;
      lVar14 = lVar14 + 0x10;
    } while (lVar14 != 0x200);
    lVar16 = lVar16 + 1;
    puVar18 = puVar18 + 0x400;
    piVar15 = piVar15 + 8;
  } while (lVar16 != 4);
  return;
}

Assistant:

static void lowbd_fwd_txfm2d_64x32_sse4_1(const int16_t *input, int32_t *output,
                                          int stride, TX_TYPE tx_type, int bd) {
  (void)bd;
  const TX_SIZE tx_size = TX_64X32;
  __m128i buf0[64], buf1[256];
  const int8_t *shift = av1_fwd_txfm_shift_ls[tx_size];
  const int txw_idx = get_txw_idx(tx_size);
  const int txh_idx = get_txh_idx(tx_size);
  const int cos_bit_col = av1_fwd_cos_bit_col[txw_idx][txh_idx];
  const int cos_bit_row = av1_fwd_cos_bit_row[txw_idx][txh_idx];
  const int width = tx_size_wide[tx_size];
  const int height = tx_size_high[tx_size];
  const transform_1d_sse2 col_txfm = col_txfm8x32_arr[tx_type];
  const int width_div8 = (width >> 3);
  const int height_div8 = (height >> 3);

  for (int i = 0; i < width_div8; i++) {
    load_buffer_16bit_to_16bit(input + 8 * i, stride, buf0, height);
    round_shift_16bit(buf0, height, shift[0]);
    col_txfm(buf0, buf0, cos_bit_col);
    round_shift_16bit(buf0, height, shift[1]);
    for (int j = 0; j < AOMMIN(4, height_div8); ++j) {
      transpose_16bit_8x8(buf0 + j * 8, buf1 + j * width + 8 * i);
    }
  }
  assert(tx_type == DCT_DCT);
  for (int i = 0; i < AOMMIN(4, height_div8); i++) {
    __m128i bufA[64];
    __m128i bufB[64];
    __m128i *buf = buf1 + width * i;
    for (int j = 0; j < width; ++j) {
      bufA[j] = _mm_cvtepi16_epi32(buf[j]);
      bufB[j] = _mm_cvtepi16_epi32(_mm_unpackhi_epi64(buf[j], buf[j]));
    }
    av1_fdct64_sse4_1(bufA, bufA, cos_bit_row, 1, 1);
    av1_fdct64_sse4_1(bufB, bufB, cos_bit_row, 1, 1);
    av1_round_shift_rect_array_32_sse4_1(bufA, bufA, 32, -shift[2], NewSqrt2);
    av1_round_shift_rect_array_32_sse4_1(bufB, bufB, 32, -shift[2], NewSqrt2);

    store_output_32bit_w8(output + i * 8, bufA, bufB, 32, 32);
  }
}